

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O0

uint parse_format(char *format,char *pformatList,uint maxFormats)

{
  char cVar1;
  uint uVar2;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  char lmod;
  uint start;
  uint index;
  uint numFormats;
  char local_21;
  uint local_20;
  uint local_1c;
  uint local_18;
  
  local_18 = 0;
  local_1c = 0;
  uVar2 = local_1c;
LAB_0011acff:
  local_1c = uVar2;
  bVar3 = false;
  if ((local_1c < 0x1000) && (bVar3 = false, *(char *)(in_RDI + (ulong)local_1c) != '\0')) {
    bVar3 = local_18 < in_EDX;
  }
  if (!bVar3) {
    return local_18;
  }
  if (*(char *)(in_RDI + (ulong)local_1c) == '%') goto code_r0x0011ad5e;
  goto LAB_0011b1f0;
code_r0x0011ad5e:
  local_20 = local_1c;
  uVar2 = local_1c + 1;
  cVar1 = *(char *)(in_RDI + (ulong)uVar2);
  if (cVar1 == '\0') goto LAB_0011acff;
  if ((cVar1 != ' ') && (cVar1 != '#')) {
    if (cVar1 == '%') goto LAB_0011acff;
    if (((cVar1 != '+') && (cVar1 != '-')) && (cVar1 != '0')) goto LAB_0011addc;
  }
  uVar2 = local_1c + 2;
LAB_0011addc:
  while( true ) {
    local_1c = uVar2;
    bVar3 = false;
    if ((*(char *)(in_RDI + (ulong)local_1c) != '\0') &&
       (bVar3 = false, '/' < *(char *)(in_RDI + (ulong)local_1c))) {
      bVar3 = *(char *)(in_RDI + (ulong)local_1c) < ':';
    }
    if (!bVar3) break;
    uVar2 = local_1c + 1;
  }
  if ((*(char *)(in_RDI + (ulong)local_1c) != '\0') && (*(char *)(in_RDI + (ulong)local_1c) == '.'))
  {
    do {
      local_1c = local_1c + 1;
      bVar3 = false;
      if ((*(char *)(in_RDI + (ulong)local_1c) != '\0') &&
         (bVar3 = false, '/' < *(char *)(in_RDI + (ulong)local_1c))) {
        bVar3 = *(char *)(in_RDI + (ulong)local_1c) < ':';
      }
    } while (bVar3);
  }
  local_21 = ' ';
  switch(*(undefined1 *)(in_RDI + (ulong)local_1c)) {
  case 0x4c:
    local_21 = 'L';
    break;
  case 0x68:
    if (*(char *)(in_RDI + (ulong)(local_1c + 1)) == 'h') {
      local_21 = 'H';
      local_1c = local_1c + 2;
    }
    else {
      local_21 = 'h';
      local_1c = local_1c + 1;
    }
    break;
  case 0x6a:
  case 0x74:
  case 0x7a:
    local_1c = local_1c + 1;
    break;
  case 0x6c:
    if (*(char *)(in_RDI + (ulong)(local_1c + 1)) == 'l') {
      local_21 = 'd';
      local_1c = local_1c + 2;
    }
    else {
      local_21 = 'l';
      local_1c = local_1c + 1;
    }
  }
  switch(*(undefined1 *)(in_RDI + (ulong)local_1c)) {
  case 0x41:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x61:
  case 0x65:
  case 0x66:
  case 0x67:
    if (local_21 == 'L') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x47;
    }
    else {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x67;
    }
    local_18 = local_18 + 1;
    local_1c = local_1c + 1;
    break;
  default:
    printf("failed to recognize format string [");
    for (; local_20 < local_1c; local_20 = local_20 + 1) {
      printf("%c",(ulong)(uint)(int)*(char *)(in_RDI + (ulong)local_20));
    }
    puts("]");
    break;
  case 0x58:
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    if (local_21 == 'H') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 99;
    }
    else if (local_21 == 'l') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x6c;
    }
    else if (local_21 == 'h') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x68;
    }
    else {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 100;
    }
    local_18 = local_18 + 1;
    local_1c = local_1c + 1;
    break;
  case 99:
    if (local_21 == 'l') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x43;
    }
    else {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 99;
    }
    local_18 = local_18 + 1;
    local_1c = local_1c + 1;
    break;
  case 0x6d:
    uVar2 = local_1c + 1;
    goto LAB_0011acff;
  case 0x6e:
    if (local_21 == 'H') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x31;
    }
    else if (local_21 == 'l') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x34;
    }
    else if (local_21 == 'h') {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x32;
    }
    else {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x33;
    }
    local_18 = local_18 + 1;
    local_1c = local_1c + 1;
    break;
  case 0x70:
    *(undefined1 *)(in_RSI + (ulong)local_18) = 0x70;
    local_18 = local_18 + 1;
    local_1c = local_1c + 1;
    break;
  case 0x73:
    if ((local_21 == 'l') || (local_21 == 'L')) {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x53;
    }
    else {
      *(undefined1 *)(in_RSI + (ulong)local_18) = 0x73;
    }
    local_18 = local_18 + 1;
    local_1c = local_1c + 1;
  }
LAB_0011b1f0:
  uVar2 = local_1c;
  if (*(char *)(in_RDI + (ulong)local_1c) != '%') {
    uVar2 = local_1c + 1;
  }
  goto LAB_0011acff;
}

Assistant:

unsigned int
parse_format(const char *format, char pformatList[], unsigned int maxFormats)
{
	unsigned int  numFormats = 0;
	unsigned int  index = 0;
	unsigned int  start = 0;
	char		  lmod = 0;

	while (index < RSIZE_MAX_STR && format[index] != '\0' && numFormats < maxFormats)
	{
		if (format[index] == '%') {
			start = index; // remember where the format string started
			// Check for flags
			switch( format[++index]) {
			case '\0': continue; // skip - end of format string
			case '%' : continue; // skip - actually a percent character
			case '#' : // convert to alternate form
			case '0' : // zero pad
			case '-' : // left adjust
			case ' ' : // pad with spaces
			case '+' : // force a sign be used
				index++; // skip the flag character
				break;
			}
			// check for and skip the optional field width
			while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
				index++;
			}
			// Check for an skip the optional precision
			if ( format[index] != '\0' && format[index] == '.') {
				index++; // skip the period
				while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
					index++;
				}
			}
			// Check for and skip the optional length modifiers
			lmod = ' ';
			switch( format[index]) {
			case 'h' : if ( format[++index] == 'h') {
				           ++index; //also recognize the 'hh' modifier
				           lmod = 'H'; // for char
			           } else {
			               lmod = 'h'; // for short
			           }
					   break;
			case 'l' : if ( format[++index] == 'l') {
				           ++index; //also recognize the 'll' modifier
				           lmod = 'd'; // for long long
			           } else {
			               lmod = 'l'; // for long
			           }
			           break;
			case 'L' : lmod = 'L'; break;
			case 'j' :
			case 'z' :
			case 't' : index++;
			           break;
			}

			// Recognize and record the actual modifier
			switch( format[index]) {
			case 'c' :
				 if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_WCHAR; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_CHAR;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'd' : case 'i' : // signed
			case 'o' : case 'u' : // unsigned
			case 'x' : case 'X' : // unsigned
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_CHAR; // store the format character
				 } else if ( lmod == 'l') {
				 	 pformatList[numFormats] = FMT_LONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_SHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_INT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'e' : case 'E' :
			case 'f' : case 'F' :
			case 'g' : case 'G' :
			case 'a' : case 'A' :
				 if ( lmod == 'L') {
					 pformatList[numFormats] = FMT_LDOUBLE; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_DOUBLE;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 's' :
				 if ( lmod == 'l' || lmod == 'L') {
					 pformatList[numFormats] = FMT_WSTRING; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_STRING;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'p' :
				 pformatList[numFormats] = FMT_VOID;
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'n' :
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_PCHAR; // store the format character
				 } else if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_PLONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_PSHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_PINT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;
			case 'm' :
			     // Does not represent an argument in the call stack
			     index++; // skip the format character
			     continue;
			default:
				printf("failed to recognize format string [");
				for (;start<index; start++) { printf("%c", format[start]); }
				puts("]");
				break;
			}
		}
        if (format[index] != '%')
            // don't know why it skips over blindly, not handling cases such as "%s%d".
            index++; // move past this character
	}

	return numFormats;
}